

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

int __thiscall
zmq::options_t::set_curve_key(options_t *this,uint8_t *destination_,void *optval_,size_t optvallen_)

{
  uint8_t *puVar1;
  long in_RCX;
  char *in_RDX;
  void *in_RSI;
  uint8_t *in_RDI;
  char z85_key [41];
  string s;
  char *in_stack_ffffffffffffff50;
  allocator *string_;
  undefined1 local_98 [40];
  undefined1 local_70;
  int local_60;
  allocator local_49;
  string local_48 [68];
  int local_4;
  
  if (in_RCX == 0x20) {
    memcpy(in_RSI,in_RDX,0x20);
    in_RDI[0x290] = '\x02';
    in_RDI[0x291] = '\0';
    in_RDI[0x292] = '\0';
    in_RDI[0x293] = '\0';
    local_4 = 0;
  }
  else {
    if (in_RCX == 0x28) {
      memcpy(local_98,in_RDX,0x28);
      local_70 = 0;
      puVar1 = zmq_z85_decode(in_RDI,in_stack_ffffffffffffff50);
      if (puVar1 != (uint8_t *)0x0) {
        in_RDI[0x290] = '\x02';
        in_RDI[0x291] = '\0';
        in_RDI[0x292] = '\0';
        in_RDI[0x293] = '\0';
        return 0;
      }
    }
    else if (in_RCX == 0x29) {
      string_ = &local_49;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,in_RDX,0x29,string_);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      std::__cxx11::string::c_str();
      puVar1 = zmq_z85_decode(in_RDI,(char *)string_);
      if (puVar1 == (uint8_t *)0x0) {
        local_60 = 2;
      }
      else {
        in_RDI[0x290] = '\x02';
        in_RDI[0x291] = '\0';
        in_RDI[0x292] = '\0';
        in_RDI[0x293] = '\0';
        local_4 = 0;
        local_60 = 1;
      }
      std::__cxx11::string::~string(local_48);
      if (local_60 == 1) {
        return local_4;
      }
    }
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int zmq::options_t::set_curve_key (uint8_t *destination_,
                                   const void *optval_,
                                   size_t optvallen_)
{
    switch (optvallen_) {
        case CURVE_KEYSIZE:
            memcpy (destination_, optval_, optvallen_);
            mechanism = ZMQ_CURVE;
            return 0;

        case CURVE_KEYSIZE_Z85 + 1: {
            const std::string s (static_cast<const char *> (optval_),
                                 optvallen_);

            if (zmq_z85_decode (destination_, s.c_str ())) {
                mechanism = ZMQ_CURVE;
                return 0;
            }
            break;
        }

        case CURVE_KEYSIZE_Z85:
            char z85_key[CURVE_KEYSIZE_Z85 + 1];
            memcpy (z85_key, reinterpret_cast<const char *> (optval_),
                    optvallen_);
            z85_key[CURVE_KEYSIZE_Z85] = 0;
            if (zmq_z85_decode (destination_, z85_key)) {
                mechanism = ZMQ_CURVE;
                return 0;
            }
            break;

        default:
            break;
    }
    return -1;
}